

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkDfsNatural(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  int *piVar11;
  Abc_Obj_t *pAVar12;
  Vec_Ptr_t *pVVar13;
  int Fill;
  Vec_Ptr_t *pVVar14;
  Vec_Ptr_t *extraout_RDX;
  Vec_Ptr_t *extraout_RDX_00;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                  ,0x115,"Vec_Ptr_t *Abc_NtkDfsNatural(Abc_Ntk_t *)");
  }
  iVar18 = pNtk->nObjs;
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  iVar16 = 8;
  if (6 < iVar18 - 1U) {
    iVar16 = iVar18;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar16;
  if (iVar16 == 0) {
    ppvVar10 = (void **)0x0;
  }
  else {
    ppvVar10 = (void **)malloc((long)iVar16 << 3);
  }
  pVVar9->pArray = ppvVar10;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar18 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar18 + 500;
    iVar15 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar15) {
      piVar11 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar11;
      if (piVar11 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar15;
    }
    if (-500 < iVar18) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar15;
  }
  iVar18 = pNtk->nTravIds;
  pNtk->nTravIds = iVar18 + 1;
  if (0x3ffffffe < iVar18) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pAVar12 = Abc_AigConst1(pNtk);
  pAVar3 = pAVar12->pNtk;
  iVar18 = pAVar3->nTravIds;
  iVar15 = pAVar12->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar15 + 1,Fill);
  if (((long)iVar15 < 0) || ((pAVar3->vTravIds).nSize <= iVar15)) {
LAB_002e841c:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar3->vTravIds).pArray[iVar15] = iVar18;
  if (iVar16 == 0) {
    if (ppvVar10 == (void **)0x0) {
      ppvVar10 = (void **)malloc(0x80);
    }
    else {
      ppvVar10 = (void **)realloc(ppvVar10,0x80);
    }
    pVVar9->pArray = ppvVar10;
    pVVar9->nCap = 0x10;
  }
  pVVar9->nSize = 1;
  *pVVar9->pArray = pAVar12;
  pVVar13 = pNtk->vObjs;
  if (0 < pVVar13->nSize) {
    pVVar14 = (Vec_Ptr_t *)0x0;
    do {
      plVar4 = (long *)pVVar13->pArray[(long)pVVar14];
      if ((plVar4 != (long *)0x0) && ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 7)) {
        if (0 < *(int *)((long)plVar4 + 0x1c)) {
          lVar17 = 0;
          pVVar13 = pVVar14;
          do {
            plVar5 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                               (long)*(int *)(plVar4[4] + lVar17 * 4) * 8);
            uVar8 = *(uint *)((long)plVar5 + 0x14) & 0xf;
            if ((uVar8 == 5) || (uVar8 == 2)) {
              lVar6 = *plVar5;
              iVar18 = (int)plVar5[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar6 + 0xe0),iVar18 + 1,(int)pVVar13);
              if (((long)iVar18 < 0) || (*(int *)(lVar6 + 0xe4) <= iVar18)) goto LAB_002e83fd;
              lVar7 = *plVar5;
              iVar16 = *(int *)(lVar7 + 0xd8);
              pVVar13 = extraout_RDX;
              if (*(int *)(*(long *)(lVar6 + 0xe8) + (long)iVar18 * 4) != iVar16) {
                iVar18 = (int)plVar5[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar7 + 0xe0),iVar18 + 1,(int)extraout_RDX);
                if (((long)iVar18 < 0) || (*(int *)(lVar7 + 0xe4) <= iVar18)) goto LAB_002e841c;
                *(int *)(*(long *)(lVar7 + 0xe8) + (long)iVar18 * 4) = iVar16;
                uVar8 = pVVar9->nSize;
                uVar2 = pVVar9->nCap;
                if (uVar8 == uVar2) {
                  if ((int)uVar2 < 0x10) {
                    if (pVVar9->pArray == (void **)0x0) {
                      ppvVar10 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar10 = (void **)realloc(pVVar9->pArray,0x80);
                    }
                    iVar18 = 0x10;
                  }
                  else {
                    iVar18 = uVar2 * 2;
                    if (iVar18 <= (int)uVar2) goto LAB_002e81b5;
                    if (pVVar9->pArray == (void **)0x0) {
                      ppvVar10 = (void **)malloc((ulong)uVar2 << 4);
                    }
                    else {
                      ppvVar10 = (void **)realloc(pVVar9->pArray,(ulong)uVar2 << 4);
                    }
                  }
                  pVVar9->pArray = ppvVar10;
                  pVVar9->nCap = iVar18;
                }
LAB_002e81b5:
                pVVar9->nSize = uVar8 + 1;
                pVVar9->pArray[(int)uVar8] = plVar5;
                pVVar13 = pVVar9;
              }
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < *(int *)((long)plVar4 + 0x1c));
        }
        uVar8 = pVVar9->nSize;
        uVar2 = pVVar9->nCap;
        if (uVar8 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar9->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(pVVar9->pArray,0x80);
            }
            iVar18 = 0x10;
          }
          else {
            iVar18 = uVar2 * 2;
            if (iVar18 <= (int)uVar2) goto LAB_002e8256;
            if (pVVar9->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar10 = (void **)realloc(pVVar9->pArray,(ulong)uVar2 << 4);
            }
          }
          pVVar9->pArray = ppvVar10;
          pVVar9->nCap = iVar18;
        }
LAB_002e8256:
        pVVar9->nSize = uVar8 + 1;
        pVVar9->pArray[(int)uVar8] = plVar4;
        if (0 < *(int *)((long)plVar4 + 0x2c)) {
          lVar17 = 0;
          pVVar13 = pVVar9;
          do {
            plVar5 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                               (long)*(int *)(plVar4[6] + lVar17 * 4) * 8);
            if (0xfffffffd < (*(uint *)((long)plVar5 + 0x14) & 0xf) - 5) {
              lVar6 = *plVar5;
              iVar18 = (int)plVar5[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar6 + 0xe0),iVar18 + 1,(int)pVVar13);
              if (((long)iVar18 < 0) || (*(int *)(lVar6 + 0xe4) <= iVar18)) {
LAB_002e83fd:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              lVar7 = *plVar5;
              iVar16 = *(int *)(lVar7 + 0xd8);
              pVVar13 = extraout_RDX_00;
              if (*(int *)(*(long *)(lVar6 + 0xe8) + (long)iVar18 * 4) != iVar16) {
                iVar18 = (int)plVar5[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar7 + 0xe0),iVar18 + 1,(int)extraout_RDX_00);
                if (((long)iVar18 < 0) || (*(int *)(lVar7 + 0xe4) <= iVar18)) goto LAB_002e841c;
                *(int *)(*(long *)(lVar7 + 0xe8) + (long)iVar18 * 4) = iVar16;
                uVar8 = pVVar9->nSize;
                uVar2 = pVVar9->nCap;
                if (uVar8 == uVar2) {
                  if ((int)uVar2 < 0x10) {
                    if (pVVar9->pArray == (void **)0x0) {
                      ppvVar10 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar10 = (void **)realloc(pVVar9->pArray,0x80);
                    }
                    iVar18 = 0x10;
                  }
                  else {
                    iVar18 = uVar2 * 2;
                    if (iVar18 <= (int)uVar2) goto LAB_002e838f;
                    if (pVVar9->pArray == (void **)0x0) {
                      ppvVar10 = (void **)malloc((ulong)uVar2 << 4);
                    }
                    else {
                      ppvVar10 = (void **)realloc(pVVar9->pArray,(ulong)uVar2 << 4);
                    }
                  }
                  pVVar9->pArray = ppvVar10;
                  pVVar9->nCap = iVar18;
                }
LAB_002e838f:
                pVVar9->nSize = uVar8 + 1;
                pVVar9->pArray[(int)uVar8] = plVar5;
                pVVar13 = pVVar9;
              }
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < *(int *)((long)plVar4 + 0x2c));
        }
      }
      pVVar14 = (Vec_Ptr_t *)((long)&pVVar14->nCap + 1);
      pVVar13 = pNtk->vObjs;
    } while ((long)pVVar14 < (long)pVVar13->nSize);
  }
  return pVVar9;
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsNatural( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pNext;
    int i, k;
    assert( Abc_NtkIsStrash(pNtk) );
    vNodes = Vec_PtrAlloc( Abc_NtkObjNum(pNtk) );
    Abc_NtkIncrementTravId( pNtk );
    // add the constant-1 nodes
    pObj = Abc_AigConst1(pNtk);
    Abc_NodeSetTravIdCurrent( pObj );
    Vec_PtrPush( vNodes, pObj );
    // add the CIs/nodes/COs in the topological order
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        // check the fanins and add CIs
        Abc_ObjForEachFanin( pObj, pNext, k )
            if ( Abc_ObjIsCi(pNext) && !Abc_NodeIsTravIdCurrent(pNext) )
            {
                Abc_NodeSetTravIdCurrent( pNext );
                Vec_PtrPush( vNodes, pNext );
            }
        // add the node
        Vec_PtrPush( vNodes, pObj );
        // check the fanouts and add COs
        Abc_ObjForEachFanout( pObj, pNext, k )
            if ( Abc_ObjIsCo(pNext) && !Abc_NodeIsTravIdCurrent(pNext) )
            {
                Abc_NodeSetTravIdCurrent( pNext );
                Vec_PtrPush( vNodes, pNext );
            }
    }
    return vNodes;
}